

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall
Network::copyCreditTransactions
          (Network *this,int index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transactionInfo,CreditCard *toAdd)

{
  int iVar1;
  CreditCard *this_00;
  reference pvVar2;
  size_type sVar3;
  long lStack_40;
  
  this_00 = (CreditCard *)operator_new(0x80);
  CreditCard::CreditCard(this_00,toAdd);
  sVar3 = (size_type)(index + 1);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(transactionInfo,sVar3);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  if (iVar1 == 1) {
    lStack_40 = 0x20;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(transactionInfo,sVar3);
    iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
    if (iVar1 == 2) {
      lStack_40 = 0x28;
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(transactionInfo,sVar3);
      iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
      if (iVar1 != 3) goto LAB_00103e33;
      lStack_40 = 0x30;
    }
  }
  Peer::addTransaction(*(Peer **)((long)&(this->peers).size + lStack_40),&toAdd->super_Transaction);
LAB_00103e33:
  sVar3 = (size_type)(index + 2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(transactionInfo,sVar3);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  if (iVar1 == 1) {
    lStack_40 = 0x20;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(transactionInfo,sVar3);
    iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
    if (iVar1 == 2) {
      lStack_40 = 0x28;
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(transactionInfo,sVar3);
      iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
      if (iVar1 != 3) {
        return;
      }
      lStack_40 = 0x30;
    }
  }
  Peer::addTransaction(*(Peer **)((long)&(this->peers).size + lStack_40),(Transaction *)this_00);
  return;
}

Assistant:

void Network::copyCreditTransactions(int index, vector<string> transactionInfo, CreditCard *toAdd)
{
    CreditCard *copyToAdd;
    copyToAdd = new CreditCard(*toAdd);
//finds which peer to add the transaction to
    if(stoi(transactionInfo.at(index + 1)) == 1)
    {
        peer1->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 2)
    {
        peer2->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 3)
    {
        peer3->addTransaction(toAdd);
    }
    //finds which peer to add the copy of the transaction to
    if(stoi(transactionInfo.at(index + 2)) == 1)
    {
        peer1->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 2)
    {
        peer2->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 3)
    {
        peer3->addTransaction(copyToAdd);
    }
}